

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_reference_unittest.cpp
# Opt level: O2

void __thiscall ArrayReference_basics_Test::TestBody(ArrayReference_basics_Test *this)

{
  reference pvVar1;
  reference actual;
  int i;
  size_type sVar2;
  char *pcVar3;
  size_type i_1;
  AssertHelper local_f8;
  AssertHelper local_f0;
  AssertionResult gtest_ar_5;
  by_value v2;
  by_value v1;
  by_reference vr2;
  by_reference vr1;
  ArrayReference<double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>
  local_60;
  ArrayReference<double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>
  local_48;
  
  memory::
  Array<double,memory::HostCoordinator<double,memory::Allocator<double,memory::impl::AlignedPolicy<8ul>>>>
  ::Array<int,void>((Array<double,memory::HostCoordinator<double,memory::Allocator<double,memory::impl::AlignedPolicy<8ul>>>>
                     *)&v1,10);
  vr1.
  super_ArrayViewImpl<memory::ArrayReference<double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>,_double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>
  ._0_8_ = v1.super_ArrayView<double,_memory::HostCoordinator<double>_>.size_;
  vr2.
  super_ArrayViewImpl<memory::ArrayReference<double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>,_double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>
  ._0_4_ = 10;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&v2,"v1.size()","10",(unsigned_long *)&vr1,(int *)&vr2);
  if (v2.super_ArrayView<double,_memory::HostCoordinator<double>_>._0_1_ == '\0') {
    testing::Message::Message((Message *)&vr1);
    if (v2.super_ArrayView<double,_memory::HostCoordinator<double>_>.pointer_ == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (char *)*v2.super_ArrayView<double,_memory::HostCoordinator<double>_>.pointer_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&vr2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/array_reference_unittest.cpp"
               ,0x10,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&vr2,(Message *)&vr1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&vr2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&vr1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&v2.super_ArrayView<double,_memory::HostCoordinator<double>_>.pointer_);
  v2.super_ArrayView<double,_memory::HostCoordinator<double>_>._0_8_ = 0;
  vr2.
  super_ArrayViewImpl<memory::ArrayReference<double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>,_double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>
  ._0_8_ = 5;
  memory::
  ArrayViewImpl<memory::ArrayReference<double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>,_double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>
  ::operator()(&vr1,&v1.super_ArrayView<double,_memory::HostCoordinator<double>_>,(size_type *)&v2,
               (size_type *)&vr2);
  v2.super_ArrayView<double,_memory::HostCoordinator<double>_>._0_8_ = 5;
  memory::
  ArrayViewImpl<memory::ArrayReference<double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>,_double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>
  ::operator()(&vr2,&v1.super_ArrayView<double,_memory::HostCoordinator<double>_>);
  gtest_ar_5._0_8_ =
       vr1.
       super_ArrayViewImpl<memory::ArrayReference<double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>,_double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>
       .pointer_;
  local_f8.data_ =
       (AssertHelperData *)v1.super_ArrayView<double,_memory::HostCoordinator<double>_>.pointer_;
  testing::internal::CmpHelperEQ<double*,double*>
            ((internal *)&v2,"vr1.data()","v1.data()",(double **)&gtest_ar_5,(double **)&local_f8);
  if (v2.super_ArrayView<double,_memory::HostCoordinator<double>_>._0_1_ == '\0') {
    testing::Message::Message((Message *)&gtest_ar_5);
    if (v2.super_ArrayView<double,_memory::HostCoordinator<double>_>.pointer_ == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (char *)*v2.super_ArrayView<double,_memory::HostCoordinator<double>_>.pointer_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/array_reference_unittest.cpp"
               ,0x14,pcVar3);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)&gtest_ar_5);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_5);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&v2.super_ArrayView<double,_memory::HostCoordinator<double>_>.pointer_);
  gtest_ar_5._0_8_ =
       vr2.
       super_ArrayViewImpl<memory::ArrayReference<double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>,_double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>
       .pointer_;
  local_f8.data_ =
       (AssertHelperData *)
       (v1.super_ArrayView<double,_memory::HostCoordinator<double>_>.pointer_ + 5);
  testing::internal::CmpHelperEQ<double*,double*>
            ((internal *)&v2,"vr2.data()","v1.data()+5",(double **)&gtest_ar_5,(double **)&local_f8)
  ;
  if (v2.super_ArrayView<double,_memory::HostCoordinator<double>_>._0_1_ == '\0') {
    testing::Message::Message((Message *)&gtest_ar_5);
    if (v2.super_ArrayView<double,_memory::HostCoordinator<double>_>.pointer_ == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (char *)*v2.super_ArrayView<double,_memory::HostCoordinator<double>_>.pointer_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/array_reference_unittest.cpp"
               ,0x15,pcVar3);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)&gtest_ar_5);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_5);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&v2.super_ArrayView<double,_memory::HostCoordinator<double>_>.pointer_);
  v2.super_ArrayView<double,_memory::HostCoordinator<double>_>.pointer_ =
       v1.super_ArrayView<double,_memory::HostCoordinator<double>_>.pointer_;
  v2.super_ArrayView<double,_memory::HostCoordinator<double>_>.size_ =
       v1.super_ArrayView<double,_memory::HostCoordinator<double>_>.size_;
  memory::
  ArrayReference<double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>
  ::operator=((ArrayReference<double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>
               *)&v2,0.0);
  memory::
  ArrayReference<double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>
  ::operator=(&vr1,1.0);
  for (sVar2 = 0; sVar2 != 5; sVar2 = sVar2 + 1) {
    pvVar1 = memory::
             ArrayViewImpl<memory::ArrayReference<double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>,_double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>
             ::operator[](&v1.super_ArrayView<double,_memory::HostCoordinator<double>_>,sVar2);
    gtest_ar_5.success_ = false;
    gtest_ar_5._1_7_ = 0x3ff00000000000;
    testing::internal::CmpHelperEQ<double,double>
              ((internal *)&v2,"v1[i]","1.",pvVar1,(double *)&gtest_ar_5);
    if (v2.super_ArrayView<double,_memory::HostCoordinator<double>_>._0_1_ == '\0') {
      testing::Message::Message((Message *)&gtest_ar_5);
      pcVar3 = "";
      if (v2.super_ArrayView<double,_memory::HostCoordinator<double>_>.pointer_ != (pointer)0x0) {
        pcVar3 = (char *)*v2.super_ArrayView<double,_memory::HostCoordinator<double>_>.pointer_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/array_reference_unittest.cpp"
                 ,0x19,pcVar3);
      testing::internal::AssertHelper::operator=(&local_f8,(Message *)&gtest_ar_5);
      testing::internal::AssertHelper::~AssertHelper(&local_f8);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_5);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&v2.super_ArrayView<double,_memory::HostCoordinator<double>_>.pointer_);
  }
  memory::
  ArrayReference<double,memory::HostCoordinator<double,memory::Allocator<double,memory::impl::AlignedPolicy<8ul>>>>
  ::operator=(&local_48,
              (ArrayReference<double,memory::HostCoordinator<double,memory::Allocator<double,memory::impl::AlignedPolicy<8ul>>>>
               *)&vr2,&vr1);
  for (sVar2 = 5; sVar2 != 10; sVar2 = sVar2 + 1) {
    pvVar1 = memory::
             ArrayViewImpl<memory::ArrayReference<double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>,_double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>
             ::operator[](&v1.super_ArrayView<double,_memory::HostCoordinator<double>_>,sVar2);
    gtest_ar_5.success_ = false;
    gtest_ar_5._1_7_ = 0x3ff00000000000;
    testing::internal::CmpHelperEQ<double,double>
              ((internal *)&v2,"v1[i]","1.",pvVar1,(double *)&gtest_ar_5);
    if (v2.super_ArrayView<double,_memory::HostCoordinator<double>_>._0_1_ == '\0') {
      testing::Message::Message((Message *)&gtest_ar_5);
      pcVar3 = "";
      if (v2.super_ArrayView<double,_memory::HostCoordinator<double>_>.pointer_ != (pointer)0x0) {
        pcVar3 = (char *)*v2.super_ArrayView<double,_memory::HostCoordinator<double>_>.pointer_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/array_reference_unittest.cpp"
                 ,0x1c,pcVar3);
      testing::internal::AssertHelper::operator=(&local_f8,(Message *)&gtest_ar_5);
      testing::internal::AssertHelper::~AssertHelper(&local_f8);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_5);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&v2.super_ArrayView<double,_memory::HostCoordinator<double>_>.pointer_);
  }
  memory::
  Array<double,memory::HostCoordinator<double,memory::Allocator<double,memory::impl::AlignedPolicy<8ul>>>>
  ::Array<int,void>((Array<double,memory::HostCoordinator<double,memory::Allocator<double,memory::impl::AlignedPolicy<8ul>>>>
                     *)&v2,10);
  local_f8.data_ =
       (AssertHelperData *)v2.super_ArrayView<double,_memory::HostCoordinator<double>_>.size_;
  local_f0.data_._0_4_ = 10;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&gtest_ar_5,"v2.size()","10",(unsigned_long *)&local_f8,(int *)&local_f0);
  if (gtest_ar_5.success_ == false) {
    testing::Message::Message((Message *)&local_f8);
    if (gtest_ar_5.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_5.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/array_reference_unittest.cpp"
               ,0x22,pcVar3);
    testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_f8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_5.message_);
  gtest_ar_5.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       v2.super_ArrayView<double,_memory::HostCoordinator<double>_>.pointer_;
  memory::
  ArrayReference<double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>
  ::operator=((ArrayReference<double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>
               *)&gtest_ar_5,-10.0);
  gtest_ar_5.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       v1.super_ArrayView<double,_memory::HostCoordinator<double>_>.pointer_;
  memory::
  ArrayReference<double,memory::HostCoordinator<double,memory::Allocator<double,memory::impl::AlignedPolicy<8ul>>>>
  ::operator=(&local_60,
              (ArrayReference<double,memory::HostCoordinator<double,memory::Allocator<double,memory::impl::AlignedPolicy<8ul>>>>
               *)&gtest_ar_5,&v2);
  local_f8.data_ =
       (AssertHelperData *)v1.super_ArrayView<double,_memory::HostCoordinator<double>_>.pointer_;
  local_f0.data_ =
       (AssertHelperData *)v2.super_ArrayView<double,_memory::HostCoordinator<double>_>.pointer_;
  testing::internal::CmpHelperNE<double*,double*>
            ((internal *)&gtest_ar_5,"v1.data()","v2.data()",(double **)&local_f8,
             (double **)&local_f0);
  if (gtest_ar_5.success_ == false) {
    testing::Message::Message((Message *)&local_f8);
    if (gtest_ar_5.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_5.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/array_reference_unittest.cpp"
               ,0x26,pcVar3);
    testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_f8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_5.message_);
  for (sVar2 = 0; v1.super_ArrayView<double,_memory::HostCoordinator<double>_>.size_ != sVar2;
      sVar2 = sVar2 + 1) {
    pvVar1 = memory::
             ArrayViewImpl<memory::ArrayReference<double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>,_double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>
             ::operator[](&v1.super_ArrayView<double,_memory::HostCoordinator<double>_>,sVar2);
    actual = memory::
             ArrayViewImpl<memory::ArrayReference<double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>,_double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>
             ::operator[](&v2.super_ArrayView<double,_memory::HostCoordinator<double>_>,sVar2);
    testing::internal::CmpHelperEQ<double,double>
              ((internal *)&gtest_ar_5,"v1[i]","v2[i]",pvVar1,actual);
    if (gtest_ar_5.success_ == false) {
      testing::Message::Message((Message *)&local_f8);
      pcVar3 = "";
      if (gtest_ar_5.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = ((gtest_ar_5.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_f0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/array_reference_unittest.cpp"
                 ,0x29,pcVar3);
      testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_f8);
      testing::internal::AssertHelper::~AssertHelper(&local_f0);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_f8);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_5.message_);
  }
  memory::
  Array<double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>
  ::~Array(&v2);
  memory::
  Array<double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>
  ::~Array(&v1);
  return;
}

Assistant:

TEST(ArrayReference, basics) {
    using namespace memory;

    using by_value = Array<double, HostCoordinator<double>>;
    using by_view  = ArrayView<double, HostCoordinator<double>>;
    using by_reference = typename by_view::array_reference_type;

    // create range by value of length 10
    by_value v1(10);
    EXPECT_EQ(v1.size(), 10);

    by_reference vr1 = v1(0,5);
    by_reference vr2 = v1(5,end);
    EXPECT_EQ(vr1.data(), v1.data());
    EXPECT_EQ(vr2.data(), v1.data()+5);
    v1(all) = 0.;
    vr1 = 1.;
    for(auto i=0; i<5; ++i)
        EXPECT_EQ(v1[i], 1.);
    vr2 = vr1;
    for(auto i=5; i<10; ++i)
        EXPECT_EQ(v1[i], 1.);

    // create a new array of lenght 10
    // and test copying it into the original array
    // via a reference
    by_value v2(10);
    EXPECT_EQ(v2.size(), 10);
    v2(all) = -10.;

    v1(all) = v2;
    EXPECT_NE(v1.data(), v2.data());

    for(auto i : v1.range())
        EXPECT_EQ(v1[i], v2[i]);
}